

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O2

QStringList * xdgDataDirs(void)

{
  QArrayDataPointer<QString> *in_RDI;
  long lVar1;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<QString> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((QString *)&local_68,"XDG_DATA_DIRS");
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  dirsList((QStringList *)in_RDI,(QString *)&local_68);
  if (in_RDI->size == 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"/usr/local/share",0x10);
    Qt::Literals::StringLiterals::operator____s(&local_38,L"/usr/share",10);
    args._M_len = 2;
    args._M_array = (iterator)&local_50;
    QList<QString>::QList((QList<QString> *)&local_80,args);
    QArrayDataPointer<QString>::operator=(in_RDI,&local_80);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
    lVar1 = 0x18;
    do {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)((long)&local_50.d + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList xdgDataDirs()
{
    // http://standards.freedesktop.org/basedir-spec/latest/
    QString xdgDataDirsEnv = qEnvironmentVariable("XDG_DATA_DIRS");

    QStringList dirs = dirsList(xdgDataDirsEnv);
    if (dirs.isEmpty())
        dirs = QStringList{u"/usr/local/share"_s, u"/usr/share"_s};

    return dirs;
}